

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O3

Type * __thiscall
slang::ast::builtins::StringOutputTask::checkArguments
          (StringOutputTask *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_4)

{
  Compilation *pCVar1;
  Type *this_00;
  bool bVar2;
  Diagnostic *diag;
  long lVar3;
  Args local_38;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar2 = SystemSubroutine::checkArgCount
                    ((SystemSubroutine *)this,context,false,args,range,1,0x7fffffff);
  lVar3 = 400;
  if (bVar2) {
    this_00 = ((*args->_M_ptr)->type).ptr;
    bVar2 = Type::canBeStringLike(this_00);
    if (bVar2) {
      local_38._M_extent._M_extent_value = (args->_M_extent)._M_extent_value - 1;
      local_38._M_ptr = args->_M_ptr + 1;
      bVar2 = FmtHelpers::checkDisplayArgs(context,&local_38);
      lVar3 = (ulong)!bVar2 * 8 + 0x188;
    }
    else {
      diag = ASTContext::addDiag(context,(DiagCode)0x1b000b,(*args->_M_ptr)->sourceRange);
      ast::operator<<(diag,this_00);
    }
  }
  return *(Type **)((long)&(pCVar1->super_BumpAllocator).head + lVar3);
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 1, INT32_MAX))
            return comp.getErrorType();

        const Type& ft = *args[0]->type;
        if (!ft.canBeStringLike()) {
            context.addDiag(diag::InvalidStringArg, args[0]->sourceRange) << ft;
            return comp.getErrorType();
        }

        if (!FmtHelpers::checkDisplayArgs(context, args.subspan(1)))
            return comp.getErrorType();

        return comp.getVoidType();
    }